

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

ll_node * ll_append_node(ll_node *root,ll_node *node)

{
  ll_node *plVar1;
  
  if (root != (ll_node *)0x0) {
    do {
      plVar1 = root;
      root = plVar1->next;
    } while (root != (ll_node *)0x0);
    plVar1->next = node;
    return node;
  }
  return (ll_node *)0x0;
}

Assistant:

struct ll_node *ll_last(struct ll_node *node)
{
	if (node == NULL) {
		return NULL;
	}
	struct ll_node *cur_node = (struct ll_node *)node;
	while (cur_node->next != NULL) {
		cur_node = cur_node->next;
	}
	return cur_node;
}